

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

int __thiscall QtMWidgets::ToolBarLayout::indexOf(ToolBarLayout *this,QAction *action)

{
  QObject *object;
  ToolButton *pTVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    while( true ) {
      if ((this->buttons).d.size <= lVar2) {
        return -1;
      }
      object = (QObject *)(**(code **)(*(long *)(this->buttons).d.ptr[lVar2] + 0x68))();
      pTVar1 = qobject_cast<QtMWidgets::ToolButton*>(object);
      if (pTVar1 != (ToolButton *)0x0) break;
      lVar2 = lVar2 + 1;
    }
    lVar2 = lVar2 + 1;
  } while (((pTVar1->d).d)->action != action);
  return (int)lVar2;
}

Assistant:

int
ToolBarLayout::indexOf( QAction * action ) const
{
	for( int i = 0; i < buttons.count(); ++i )
	{
		ToolButton * b = qobject_cast< ToolButton* >
			( buttons.at( i )->widget() );

		if( b && b->action() == action )
			return i + 1;
	}

	return -1;
}